

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

PHYSFS_sint64 PHYSFS_readBytes(PHYSFS_File *handle,void *buffer,PHYSFS_uint64 _len)

{
  PHYSFS_uint64 maxlen;
  FileHandle *fh;
  size_t len;
  PHYSFS_sint64 retval;
  PHYSFS_uint64 _len_local;
  void *buffer_local;
  PHYSFS_File *handle_local;
  
  maxlen = (PHYSFS_uint64)handle;
  if (handle->opaque == (void *)0x0) {
    if (magicStream == (FileHandle *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_IO);
      return -1;
    }
    maxlen = (PHYSFS_uint64)magicStream;
  }
  if (_len < 0x8000000000000000) {
    if (*(char *)(maxlen + 8) == '\0') {
      PHYSFS_setErrorCode(PHYSFS_ERR_OPEN_FOR_WRITING);
      handle_local = (PHYSFS_File *)0xffffffffffffffff;
    }
    else if (_len == 0) {
      handle_local = (PHYSFS_File *)0x0;
    }
    else if (*(long *)(maxlen + 0x18) == 0) {
      handle_local = (PHYSFS_File *)
                     (**(code **)(*(long *)maxlen + 0x10))(*(undefined8 *)maxlen,buffer,_len);
      if (((magicStream != (FileHandle *)0x0) && (magicStream->forReading == '\0')) &&
         (handle_local != (PHYSFS_File *)0xffffffffffffffff)) {
        PHYSFS_writeBytes((PHYSFS_File *)magicStream,buffer,(PHYSFS_uint64)handle_local);
      }
    }
    else {
      handle_local = (PHYSFS_File *)doBufferedRead((FileHandle *)maxlen,buffer,_len);
    }
  }
  else {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    handle_local = (PHYSFS_File *)0xffffffffffffffff;
  }
  return (PHYSFS_sint64)handle_local;
}

Assistant:

PHYSFS_sint64 PHYSFS_readBytes(PHYSFS_File *handle, void *buffer,
                               PHYSFS_uint64 _len)
{
    PHYSFS_sint64 retval;
    const size_t len = (size_t) _len;
    FileHandle *fh = (FileHandle *) handle;

    if (fh->io == NULL)
    {
        BAIL_IF(magicStream == NULL, PHYSFS_ERR_IO, -1);
        fh = magicStream;
    }

#ifdef PHYSFS_NO_64BIT_SUPPORT
    const PHYSFS_uint64 maxlen = __PHYSFS_UI64(0x7FFFFFFF);
#else
    const PHYSFS_uint64 maxlen = __PHYSFS_UI64(0x7FFFFFFFFFFFFFFF);
#endif

    if (!__PHYSFS_ui64FitsAddressSpace(_len))
        BAIL(PHYSFS_ERR_INVALID_ARGUMENT, -1);

    BAIL_IF(_len > maxlen, PHYSFS_ERR_INVALID_ARGUMENT, -1);
    BAIL_IF(!fh->forReading, PHYSFS_ERR_OPEN_FOR_WRITING, -1);
    BAIL_IF_ERRPASS(len == 0, 0);

    if (fh->buffer)
        return doBufferedRead(fh, buffer, len);

    retval = fh->io->read(fh->io, buffer, len);

    /* complete failure at read will mess up the magic stream.. */
    if (magicStream && !magicStream->forReading && retval != -1)
        PHYSFS_writeBytes((PHYSFS_File *)magicStream, buffer, retval);

    return retval;
}